

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMemory.cpp
# Opt level: O0

void * __thiscall SharedMemory::attach(SharedMemory *this,AttachFlag flag,void *address)

{
  void *pvVar1;
  int *piVar2;
  String local_80;
  String local_60;
  Log local_40;
  uint local_2c;
  void *pvStack_28;
  int flg;
  void *address_local;
  SharedMemory *pSStack_18;
  AttachFlag flag_local;
  SharedMemory *this_local;
  
  if (this->mAddr == (void *)0x0) {
    local_2c = 0;
    if (address != (void *)0x0) {
      local_2c = 0x2000;
    }
    if ((flag & ReadWrite) == Read) {
      local_2c = local_2c | 0x1000;
    }
    pvStack_28 = address;
    address_local._4_4_ = flag;
    pSStack_18 = this;
    pvVar1 = shmat(this->mShm,address,local_2c);
    this->mAddr = pvVar1;
    if (this->mAddr == (void *)0xffffffffffffffff) {
      ::error();
      piVar2 = __errno_location();
      Rct::strerror((Rct *)&local_80,*piVar2);
      ::operator<<((Log *)&local_60.mString.field_2,&local_60);
      __errno_location();
      Log::operator<<(&local_40,(int)&local_60 + 0x10);
      Log::~Log(&local_40);
      Log::~Log((Log *)&local_60.mString.field_2);
      String::~String(&local_80);
      Log::~Log((Log *)&local_60);
      this->mAddr = (void *)0x0;
    }
    this_local = (SharedMemory *)this->mAddr;
  }
  else {
    this_local = (SharedMemory *)this->mAddr;
  }
  return this_local;
}

Assistant:

void* SharedMemory::attach(AttachFlag flag, void* address)
{
    if (mAddr)
        return mAddr;

    int flg = address ? SHM_RND : 0;
    if (!(flag & Write))
        flg |= SHM_RDONLY;
    mAddr = shmat(mShm, address, flg);
    if (mAddr == reinterpret_cast<void*>(-1)) {
        error() << Rct::strerror() << errno;
        mAddr = 0;
    }
    return mAddr;
}